

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O0

unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
__thiscall
duckdb::ColumnData::Checkpoint
          (ColumnData *this,RowGroup *row_group,ColumnCheckpointInfo *checkpoint_info)

{
  initializer_list<std::reference_wrapper<duckdb::ColumnCheckpointState>_> iVar1;
  bool bVar2;
  type pCVar3;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  in_RDI;
  ColumnDataCheckpointer checkpointer;
  vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> states;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *nodes;
  unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
  *checkpoint_state;
  ColumnCheckpointState *in_stack_fffffffffffffdd8;
  BaseStatistics *in_stack_fffffffffffffde0;
  ColumnDataCheckpointer *this_00;
  iterator prVar4;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  *in_stack_fffffffffffffdf0;
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> this_01;
  BaseStatistics *in_stack_fffffffffffffe28;
  ColumnDataCheckpointer *in_stack_fffffffffffffe30;
  LogicalType *in_stack_fffffffffffffe48;
  ColumnDataCheckpointer *in_stack_fffffffffffffe90;
  ColumnCheckpointInfo *in_stack_fffffffffffffeb0;
  RowGroup *in_stack_fffffffffffffeb8;
  DatabaseInstance *in_stack_fffffffffffffec0;
  vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> *in_stack_fffffffffffffec8;
  ColumnDataCheckpointer *in_stack_fffffffffffffed0;
  undefined1 local_f1 [9];
  ColumnDataCheckpointer *local_e8;
  undefined8 local_e0;
  undefined4 local_bc;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *local_b8;
  byte local_21;
  
  local_21 = 0;
  this_01._M_head_impl =
       (ColumnCheckpointState *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
       .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl;
  (**(code **)(*in_RSI + 0xd8))
            (in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
             .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl,in_RSI,
             in_RDX,*(undefined8 *)*in_RCX);
  LogicalType::LogicalType
            (&in_stack_fffffffffffffde0->type,(LogicalType *)in_stack_fffffffffffffdd8);
  BaseStatistics::CreateEmpty(in_stack_fffffffffffffe48);
  BaseStatistics::ToUnique(in_stack_fffffffffffffe28);
  unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
  ::operator->((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                *)in_stack_fffffffffffffde0);
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::operator=
            ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              *)in_stack_fffffffffffffde0,
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              *)in_stack_fffffffffffffdd8);
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::~unique_ptr
            ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              *)0xb94997);
  BaseStatistics::~BaseStatistics(in_stack_fffffffffffffde0);
  LogicalType::~LogicalType((LogicalType *)0xb949b1);
  local_b8 = SegmentTree<duckdb::ColumnSegment,_false>::ReferenceSegments
                       ((SegmentTree<duckdb::ColumnSegment,_false> *)this_01._M_head_impl);
  bVar2 = ::std::
          vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
          ::empty(in_stack_fffffffffffffdf0);
  if (bVar2) {
    local_21 = 1;
    local_bc = 1;
  }
  else {
    pCVar3 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
             ::operator*((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                          *)in_stack_fffffffffffffde0);
    this_00 = (ColumnDataCheckpointer *)(local_f1 + 1);
    ::std::reference_wrapper<duckdb::ColumnCheckpointState>::
    reference_wrapper<duckdb::ColumnCheckpointState&,void,duckdb::ColumnCheckpointState*>
              ((reference_wrapper<duckdb::ColumnCheckpointState> *)this_00,in_stack_fffffffffffffdd8
              );
    local_e0 = 1;
    prVar4 = (iterator)local_f1;
    local_e8 = this_00;
    ::std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>::allocator
              ((allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_> *)0xb94ad9);
    iVar1._M_len = (size_type)pCVar3;
    iVar1._M_array = prVar4;
    vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true>::vector
              ((vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> *)this_00,iVar1,
               (allocator_type *)in_stack_fffffffffffffdd8);
    ::std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>::~allocator
              ((allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_> *)0xb94b0a);
    GetDatabase((ColumnData *)0xb94b14);
    ColumnDataCheckpointer::ColumnDataCheckpointer
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    ColumnDataCheckpointer::Checkpoint(in_stack_fffffffffffffe30);
    ColumnDataCheckpointer::FinalizeCheckpoint(in_stack_fffffffffffffe90);
    local_21 = 1;
    local_bc = 1;
    ColumnDataCheckpointer::~ColumnDataCheckpointer(this_00);
    vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true>::~vector
              ((vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> *)0xb94b84);
  }
  if ((local_21 & 1) == 0) {
    unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
    ::~unique_ptr((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                   *)0xb94c00);
  }
  return (unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
          )(__uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
             .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ColumnCheckpointState> ColumnData::Checkpoint(RowGroup &row_group, ColumnCheckpointInfo &checkpoint_info) {
	// scan the segments of the column data
	// set up the checkpoint state
	auto checkpoint_state = CreateCheckpointState(row_group, checkpoint_info.info.manager);
	checkpoint_state->global_stats = BaseStatistics::CreateEmpty(type).ToUnique();

	auto &nodes = data.ReferenceSegments();
	if (nodes.empty()) {
		// empty table: flush the empty list
		return checkpoint_state;
	}

	vector<reference<ColumnCheckpointState>> states {*checkpoint_state};
	ColumnDataCheckpointer checkpointer(states, GetDatabase(), row_group, checkpoint_info);
	checkpointer.Checkpoint();
	checkpointer.FinalizeCheckpoint();
	return checkpoint_state;
}